

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.c
# Opt level: O0

void lodepng_state_init(LodePNGState *state)

{
  LodePNGState *state_local;
  
  lodepng_decoder_settings_init(&state->decoder);
  lodepng_encoder_settings_init(&state->encoder);
  lodepng_color_mode_init(&state->info_raw);
  lodepng_info_init(&state->info_png);
  state->error = 1;
  return;
}

Assistant:

void lodepng_state_init(LodePNGState* state)
{
#ifdef LODEPNG_COMPILE_DECODER
  lodepng_decoder_settings_init(&state->decoder);
#endif /*LODEPNG_COMPILE_DECODER*/
#ifdef LODEPNG_COMPILE_ENCODER
  lodepng_encoder_settings_init(&state->encoder);
#endif /*LODEPNG_COMPILE_ENCODER*/
  lodepng_color_mode_init(&state->info_raw);
  lodepng_info_init(&state->info_png);
  state->error = 1;
}